

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.h
# Opt level: O1

node * __thiscall spsc_queue<int>::alloc_node(spsc_queue<int> *this)

{
  node *pnVar1;
  
  pnVar1 = this->first_;
  if (pnVar1 == this->tail_copy_) {
    this->tail_copy_ = this->tail_;
    pnVar1 = this->first_;
    if (pnVar1 == this->tail_) {
      pnVar1 = (node *)operator_new(0x10);
      return pnVar1;
    }
  }
  this->first_ = pnVar1->next_;
  return pnVar1;
}

Assistant:

node* alloc_node() 
  { 
      // first tries to allocate node from internal node cache, 
      // if attempt fails, allocates node via ::operator new() 

      if (first_ != tail_copy_) 
      { 
          node* n = first_; 
          first_ = first_->next_; 
          return n; 
      } 
      tail_copy_ = load_consume(&tail_); 
      if (first_ != tail_copy_) 
      { 
          node* n = first_; 
          first_ = first_->next_; 
          return n; 
      } 
      node* n = new node; 
      return n; 
  }